

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O0

void Abc_SclWriteSurface(Vec_Str_t *vOut,SC_Surface *p)

{
  int iVar1;
  Vec_Flt_t *p_00;
  float fVar2;
  int local_2c;
  int local_28;
  int k;
  int i;
  float Entry;
  Vec_Flt_t *vVec;
  SC_Surface *p_local;
  Vec_Str_t *vOut_local;
  
  iVar1 = Vec_FltSize(&p->vIndex0);
  Vec_StrPutI(vOut,iVar1);
  for (local_28 = 0; iVar1 = Vec_FltSize(&p->vIndex0), local_28 < iVar1; local_28 = local_28 + 1) {
    fVar2 = Vec_FltEntry(&p->vIndex0,local_28);
    Vec_StrPutF(vOut,fVar2);
  }
  iVar1 = Vec_FltSize(&p->vIndex1);
  Vec_StrPutI(vOut,iVar1);
  for (local_28 = 0; iVar1 = Vec_FltSize(&p->vIndex1), local_28 < iVar1; local_28 = local_28 + 1) {
    fVar2 = Vec_FltEntry(&p->vIndex1,local_28);
    Vec_StrPutF(vOut,fVar2);
  }
  for (local_28 = 0; iVar1 = Vec_PtrSize(&p->vData), local_28 < iVar1; local_28 = local_28 + 1) {
    p_00 = (Vec_Flt_t *)Vec_PtrEntry(&p->vData,local_28);
    for (local_2c = 0; iVar1 = Vec_FltSize(p_00), local_2c < iVar1; local_2c = local_2c + 1) {
      fVar2 = Vec_FltEntry(p_00,local_2c);
      Vec_StrPutF(vOut,fVar2);
    }
  }
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    Vec_StrPutF(vOut,p->approx[0][local_28]);
  }
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    Vec_StrPutF(vOut,p->approx[1][local_28]);
  }
  for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
    Vec_StrPutF(vOut,p->approx[2][local_28]);
  }
  return;
}

Assistant:

static void Abc_SclWriteSurface( Vec_Str_t * vOut, SC_Surface * p )
{
    Vec_Flt_t * vVec;
    float Entry;
    int i, k;

    Vec_StrPutI( vOut, Vec_FltSize(&p->vIndex0) );
    Vec_FltForEachEntry( &p->vIndex0, Entry, i )
        Vec_StrPutF( vOut, Entry );

    Vec_StrPutI( vOut, Vec_FltSize(&p->vIndex1) );
    Vec_FltForEachEntry( &p->vIndex1, Entry, i )
        Vec_StrPutF( vOut, Entry );

    Vec_PtrForEachEntry( Vec_Flt_t *, &p->vData, vVec, i )
        Vec_FltForEachEntry( vVec, Entry, k )
            Vec_StrPutF( vOut, Entry );

    for ( i = 0; i < 3; i++ ) 
        Vec_StrPutF( vOut, p->approx[0][i] );
    for ( i = 0; i < 4; i++ ) 
        Vec_StrPutF( vOut, p->approx[1][i] );
    for ( i = 0; i < 6; i++ ) 
        Vec_StrPutF( vOut, p->approx[2][i] );
}